

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O2

string * __thiscall mbc::Val::Person::hash__abi_cxx11_(string *__return_storage_ptr__,Person *this)

{
  Ch *pCVar1;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_b8;
  Stack<rapidjson::CrtAllocator> local_78;
  string local_48;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_28;
  
  local_b8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78;
  local_78.stack_ = (char *)0x0;
  local_78.stackTop_ = (char *)0x0;
  local_78.stackEnd_ = (char *)0x0;
  local_78.allocator_ = (CrtAllocator *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  local_78.initialCapacity_ = 0x100;
  local_b8.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_b8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_b8.level_stack_.stackEnd_ = (char *)0x0;
  local_b8.level_stack_.stack_ = (char *)0x0;
  local_b8.level_stack_.stackTop_ = (char *)0x0;
  local_b8.level_stack_.initialCapacity_ = 0x200;
  local_b8.maxDecimalPlaces_ = 0x144;
  local_b8.hasRoot_ = false;
  json_value((Person *)&stack0xffffffffffffffd8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (local_28,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  pCVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_78);
  std::__cxx11::string::string((string *)&local_48,pCVar1,(allocator *)&stack0xffffffffffffffd8);
  units::md5(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_b8.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_78);
  return __return_storage_ptr__;
}

Assistant:

string Person::hash_() {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    // why I should add a prefix?
    Person::json_value() -> Accept(writer);
    return units::md5(buffer.GetString());
}